

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

bool __thiscall
Test::Suite::run(Suite *this,Output *out,
                vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods
                ,bool continueOnError)

{
  uint uVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer prVar4;
  int iVar5;
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  *__range2;
  shared_ptr<Test::Suite> *suite;
  pointer psVar6;
  reference_wrapper<const_Test::Suite::TestMethod> *method;
  pointer prVar7;
  pair<bool,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> pVar8;
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  selectedTestMethods;
  _Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  local_48;
  
  filterTests((vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
               *)&local_48,(Suite *)out,selectedMethods);
  this->continueAfterFail = continueOnError;
  this->output = out;
  (*out->_vptr_Output[2])
            (out,&this->suiteName,
             (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 3);
  (this->totalDuration).__r = 0;
  this->positiveTestMethods = 0;
  iVar5 = (*this->_vptr_Suite[5])(this);
  prVar4 = local_48._M_impl.super__Vector_impl_data._M_finish;
  prVar7 = local_48._M_impl.super__Vector_impl_data._M_start;
  if ((char)iVar5 != '\0') {
    for (; prVar7 != prVar4; prVar7 = prVar7 + 1) {
      pVar8 = runTestMethod(this,prVar7->_M_data);
      (this->totalDuration).__r = (this->totalDuration).__r + pVar8.second.__r.__r;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->positiveTestMethods = this->positiveTestMethods + 1;
      }
    }
    (*this->_vptr_Suite[6])(this);
  }
  (*out->_vptr_Output[3])
            (out,&this->suiteName,
             (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 3,
             (ulong)this->positiveTestMethods,(this->totalDuration).__r);
  psVar2 = (this->subSuites).
           super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->subSuites).
                super__Vector_base<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    peVar3 = (psVar6->super___shared_ptr<Test::Suite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar3->_vptr_Suite[3])(peVar3,out,selectedMethods,(ulong)this->continueAfterFail);
  }
  uVar1 = this->positiveTestMethods;
  std::
  _Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ::~_Vector_base(&local_48);
  return (long)local_48._M_impl.super__Vector_impl_data._M_finish -
         (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)uVar1;
}

Assistant:

bool Suite::run(Output &out, const std::vector<TestMethodInfo> &selectedMethods, bool continueOnError) {
  auto selectedTestMethods = filterTests(selectedMethods);

  this->continueAfterFail = continueOnError;
  this->output = &out;
  out.initializeSuite(suiteName, static_cast<unsigned>(selectedTestMethods.size()));
  // run tests
  totalDuration = std::chrono::microseconds::zero();
  positiveTestMethods = 0;
  // run setup before all tests
  if (setup()) {
    for (const auto &method : selectedTestMethods) {
      std::pair<bool, std::chrono::microseconds> result = runTestMethod(method.get());
      totalDuration += result.second;
      if (result.first)
        ++positiveTestMethods;
    }
    // run tear-down after all tests
    tear_down();
  }
  out.finishSuite(suiteName, static_cast<unsigned>(selectedTestMethods.size()), positiveTestMethods, totalDuration);

  // run sub-suites
  for (std::shared_ptr<Test::Suite> &suite : subSuites) {
    suite->run(out, selectedMethods, continueAfterFail);
  }

  return positiveTestMethods == selectedTestMethods.size();
}